

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFusage.c
# Opt level: O3

uint64_t NFusage_worker(char *name,int mode)

{
  int __fd;
  NF_link_map *pNVar1;
  char *pcVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  NF_list *nl;
  filebuf fb;
  undefined1 local_370 [32];
  Elf64_Addr local_350;
  ushort local_338;
  
  __fd = open(name,0);
  if (__fd == -1) {
    printf("In mapping %s as an NF: file not found\n",name);
  }
  head = (NF_list *)calloc(0x20,1);
  tail = head;
  read(__fd,local_370,0x340);
  pNVar1 = (NF_link_map *)calloc(0x298,1);
  head->map = pNVar1;
  nl = head;
  head->fd = __fd;
  pcVar2 = strdup(name);
  pNVar1 = nl->map;
  pNVar1->l_name = pcVar2;
  pNVar1->l_phnum = local_338;
  pNVar1->l_phlen = (ulong)local_338 * 0x38;
  pNVar1->l_phoff = local_350;
  sys_path[0] = "/usr/lib/x86_64-linux-gnu/";
  sys_path[1] = "/lib/x86_64-linux-gnu/";
  uVar4 = 0;
  do {
    uVar3 = dissect_and_calculate(nl);
    uVar4 = uVar4 + uVar3;
    nl = nl->next;
  } while (nl != (NF_list *)0x0);
  return uVar4;
}

Assistant:

uint64_t NFusage_worker(const char *name, int mode)
{
    /* examine the full dependency list, and calculate the space needed
     * look into the header of everything on the list
     * The list is declared by the head and tail pointer. In this function
     * the list is built, and later it is used to do the reloc for everything
     * before NFopen returns, the list should be freed.
     */
    int fd = open(name, O_RDONLY);
    if (fd == -1)
    {
        //check the DT_RUNPATH of current map
        printf("In mapping %s as an NF: file not found\n", name);
    }
    //set head and tail when cold start
    head = calloc(sizeof(struct NF_list), 1);
    tail = head;

    //fill in info needed for dissect
    struct filebuf fb;
    fb.len = 0;
    size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);
    Elf64_Ehdr *ehdr = (Elf64_Ehdr *)fb.buf;
    Elf64_Addr maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

    //allocate the link map early, and fill in some info
    head->map = calloc(sizeof(struct NF_link_map), 1);
    head->fd = fd;
    char *real_name = strdup(name); //don't forget to free it when destroying a link_map!
    head->map->l_name = real_name;
    head->map->l_phnum = ehdr->e_phnum;
    head->map->l_phlen = maplength;
    head->map->l_phoff = ehdr->e_phoff;

    //not useful for we're using calloc
    //head->next = NULL;
    init_system_path(); //init default search path before actually working
    struct NF_list *iter = head;
    Elf64_Addr total = 0;
    while (iter != NULL)
    {
        total += dissect_and_calculate(iter);
        iter = iter->next;
    }

    return total;
}